

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::ExtPrivkey::ExtPrivkey(ExtPrivkey *this,ByteData *serialize_data,ByteData256 *tweak_sum)

{
  undefined8 uVar1;
  bool bVar2;
  undefined4 in_stack_ffffffffffffffac;
  CfdError error_code;
  CfdException *in_stack_ffffffffffffffb0;
  ByteData256 *tweak_sum_local;
  ByteData *serialize_data_local;
  ExtPrivkey *this_local;
  
  Extkey::Extkey(&this->super_Extkey,serialize_data,tweak_sum);
  bVar2 = Privkey::IsValid((Privkey *)((long)this + 0x40));
  if (!bVar2) {
    error_code = CONCAT13(SUB41((uint)in_stack_ffffffffffffffac >> 0x18,0),
                          CONCAT12(1,CONCAT11(bVar2,(char)in_stack_ffffffffffffffac)));
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb0,
               "Invalid serialize data. this data is ExtPubkey data.",
               (allocator *)&stack0xffffffffffffffaf);
    CfdException::CfdException(in_stack_ffffffffffffffb0,error_code,(string *)this);
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

ExtPrivkey::ExtPrivkey(
    const ByteData& serialize_data, const ByteData256& tweak_sum)
    : Extkey(serialize_data, tweak_sum) {
  if (!privkey_.IsValid()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid serialize data. this data is ExtPubkey data.");
  }
}